

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  bool bVar1;
  pointer ppVar2;
  reference ppcVar3;
  string *psVar4;
  __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
  local_90;
  __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
  local_88;
  const_iterator j;
  string separator;
  string output;
  Property *property;
  _Self local_30;
  const_iterator i;
  string *value_local;
  string *prop_local;
  cmInstalledFile *this_local;
  
  i._M_node = (_Base_ptr)value;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
       ::find(&this->Properties,prop);
  property = (Property *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
             ::end(&this->Properties);
  bVar1 = std::operator==(&local_30,(_Self *)&property);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
             ::operator->(&local_30);
    std::__cxx11::string::string((string *)(separator.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&j);
    local_88._M_current =
         (cmCompiledGeneratorExpression **)
         std::
         vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
         begin(&(ppVar2->second).ValueExpressions);
    while( true ) {
      local_90._M_current =
           (cmCompiledGeneratorExpression **)
           std::
           vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
           ::end(&(ppVar2->second).ValueExpressions);
      bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)(separator.field_2._M_local_buf + 8),(string *)&j);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
                ::operator*(&local_88);
      psVar4 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(*ppcVar3);
      std::__cxx11::string::operator+=
                ((string *)(separator.field_2._M_local_buf + 8),(string *)psVar4);
      std::__cxx11::string::operator=((string *)&j,";");
      __gnu_cxx::
      __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
      ::operator++(&local_88);
    }
    std::__cxx11::string::operator=
              ((string *)i._M_node,(string *)(separator.field_2._M_local_buf + 8));
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&j);
    std::__cxx11::string::~string((string *)(separator.field_2._M_local_buf + 8));
  }
  return this_local._7_1_;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  PropertyMapType::const_iterator i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (ExpressionVectorType::const_iterator j =
         property.ValueExpressions.begin();
       j != property.ValueExpressions.end(); ++j) {
    output += separator;
    output += (*j)->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}